

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lobject.c
# Opt level: O0

char * luaO_pushvfstring(lua_State *L,char *fmt,__va_list_tag *argp)

{
  uint uVar1;
  long *plVar2;
  undefined8 *puVar3;
  char *str;
  __va_list_tag *str_00;
  char *pcVar4;
  int iVar5;
  size_t sVar6;
  unsigned_long *local_170;
  undefined8 *local_150;
  undefined8 *local_138;
  undefined8 *local_118;
  int *local_100;
  uint *local_e8;
  long *local_c0;
  char local_9c [4];
  int l_1;
  char buff_2 [8];
  int l;
  void *p;
  char buff_1 [40];
  TValue *io_2;
  TValue *io_1;
  TValue *io;
  char *pcStack_38;
  char buff;
  char *s;
  char *e;
  __va_list_tag *p_Stack_20;
  int n;
  __va_list_tag *argp_local;
  char *fmt_local;
  lua_State *L_local;
  
  e._4_4_ = 0;
  p_Stack_20 = argp;
  argp_local = (__va_list_tag *)fmt;
  fmt_local = (char *)L;
  do {
    s = strchr((char *)argp_local,0x25);
    if (s == (char *)0x0) {
      if (*(long *)(fmt_local + 0x30) - *(long *)(fmt_local + 0x10) >> 4 < 2) {
        luaD_growstack((lua_State *)fmt_local,1);
      }
      pcVar4 = fmt_local;
      str_00 = argp_local;
      sVar6 = strlen((char *)argp_local);
      pushstr((lua_State *)pcVar4,(char *)str_00,sVar6);
      if (0 < e._4_4_) {
        luaV_concat((lua_State *)fmt_local,e._4_4_ + 1);
      }
      return (char *)(*(long *)(*(long *)(fmt_local + 0x10) + -0x10) + 0x18);
    }
    pushstr((lua_State *)fmt_local,(char *)argp_local,(long)s - (long)argp_local);
    pcVar4 = fmt_local;
    switch(s[1]) {
    case '%':
      pushstr((lua_State *)fmt_local,"%",1);
      break;
    default:
      luaG_runerror((lua_State *)fmt_local,"invalid option \'%%%c\' to \'lua_pushfstring\'",
                    (ulong)(uint)(int)s[1]);
    case 'I':
      puVar3 = *(undefined8 **)(fmt_local + 0x10);
      uVar1 = p_Stack_20->gp_offset;
      if (uVar1 < 0x29) {
        local_118 = (undefined8 *)((long)(int)uVar1 + (long)p_Stack_20->reg_save_area);
        p_Stack_20->gp_offset = uVar1 + 8;
      }
      else {
        local_118 = (undefined8 *)p_Stack_20->overflow_arg_area;
        p_Stack_20->overflow_arg_area = local_118 + 1;
      }
      *puVar3 = *local_118;
      *(undefined4 *)(puVar3 + 1) = 0x13;
      goto LAB_0011fb25;
    case 'U':
      uVar1 = p_Stack_20->gp_offset;
      if (uVar1 < 0x29) {
        local_170 = (unsigned_long *)((long)(int)uVar1 + (long)p_Stack_20->reg_save_area);
        p_Stack_20->gp_offset = uVar1 + 8;
      }
      else {
        local_170 = (unsigned_long *)p_Stack_20->overflow_arg_area;
        p_Stack_20->overflow_arg_area = local_170 + 1;
      }
      iVar5 = luaO_utf8esc(local_9c,*local_170);
      pushstr((lua_State *)fmt_local,buff_2 + -(long)iVar5,(long)iVar5);
      break;
    case 'c':
      uVar1 = p_Stack_20->gp_offset;
      if (uVar1 < 0x29) {
        local_e8 = (uint *)((long)(int)uVar1 + (long)p_Stack_20->reg_save_area);
        p_Stack_20->gp_offset = uVar1 + 8;
      }
      else {
        local_e8 = (uint *)p_Stack_20->overflow_arg_area;
        p_Stack_20->overflow_arg_area = local_e8 + 2;
      }
      io._7_1_ = (byte)*local_e8;
      if ((""[(int)((*local_e8 & 0xff) + 1)] & 4) == 0) {
        luaO_pushfstring((lua_State *)fmt_local,"<\\%d>",(ulong)io._7_1_);
      }
      else {
        pushstr((lua_State *)fmt_local,(char *)((long)&io + 7),1);
      }
      break;
    case 'd':
      plVar2 = *(long **)(fmt_local + 0x10);
      uVar1 = p_Stack_20->gp_offset;
      if (uVar1 < 0x29) {
        local_100 = (int *)((long)(int)uVar1 + (long)p_Stack_20->reg_save_area);
        p_Stack_20->gp_offset = uVar1 + 8;
      }
      else {
        local_100 = (int *)p_Stack_20->overflow_arg_area;
        p_Stack_20->overflow_arg_area = local_100 + 2;
      }
      *plVar2 = (long)*local_100;
      *(undefined4 *)(plVar2 + 1) = 0x13;
      goto LAB_0011fb25;
    case 'f':
      puVar3 = *(undefined8 **)(fmt_local + 0x10);
      uVar1 = p_Stack_20->fp_offset;
      if (uVar1 < 0xa1) {
        local_138 = (undefined8 *)((long)(int)uVar1 + (long)p_Stack_20->reg_save_area);
        p_Stack_20->fp_offset = uVar1 + 0x10;
      }
      else {
        local_138 = (undefined8 *)p_Stack_20->overflow_arg_area;
        p_Stack_20->overflow_arg_area = local_138 + 1;
      }
      *puVar3 = *local_138;
      *(undefined4 *)(puVar3 + 1) = 3;
LAB_0011fb25:
      luaD_inctop((lua_State *)fmt_local);
      luaO_tostring((lua_State *)fmt_local,(StkId)(*(long *)(fmt_local + 0x10) + -0x10));
      break;
    case 'p':
      uVar1 = p_Stack_20->gp_offset;
      if (uVar1 < 0x29) {
        local_150 = (undefined8 *)((long)(int)uVar1 + (long)p_Stack_20->reg_save_area);
        p_Stack_20->gp_offset = uVar1 + 8;
      }
      else {
        local_150 = (undefined8 *)p_Stack_20->overflow_arg_area;
        p_Stack_20->overflow_arg_area = local_150 + 1;
      }
      unique0x00012000 = *local_150;
      buff_2._0_4_ = snprintf((char *)&p,0x28,"%p",unique0x00012000);
      pushstr((lua_State *)fmt_local,(char *)&p,(long)(int)buff_2._0_4_);
      break;
    case 's':
      uVar1 = p_Stack_20->gp_offset;
      if (uVar1 < 0x29) {
        local_c0 = (long *)((long)(int)uVar1 + (long)p_Stack_20->reg_save_area);
        p_Stack_20->gp_offset = uVar1 + 8;
      }
      else {
        local_c0 = (long *)p_Stack_20->overflow_arg_area;
        p_Stack_20->overflow_arg_area = local_c0 + 1;
      }
      pcStack_38 = (char *)*local_c0;
      if (pcStack_38 == (char *)0x0) {
        pcStack_38 = "(null)";
      }
      str = pcStack_38;
      sVar6 = strlen(pcStack_38);
      pushstr((lua_State *)pcVar4,str,sVar6);
    }
    e._4_4_ = e._4_4_ + 2;
    argp_local = (__va_list_tag *)(s + 2);
  } while( true );
}

Assistant:

const char *luaO_pushvfstring (lua_State *L, const char *fmt, va_list argp) {
  int n = 0;
  for (;;) {
    const char *e = strchr(fmt, '%');
    if (e == NULL) break;
    pushstr(L, fmt, e - fmt);
    switch (*(e+1)) {
      case 's': {  /* zero-terminated string */
        const char *s = va_arg(argp, char *);
        if (s == NULL) s = "(null)";
        pushstr(L, s, strlen(s));
        break;
      }
      case 'c': {  /* an 'int' as a character */
        char buff = cast(char, va_arg(argp, int));
        if (lisprint(cast_uchar(buff)))
          pushstr(L, &buff, 1);
        else  /* non-printable character; print its code */
          luaO_pushfstring(L, "<\\%d>", cast_uchar(buff));
        break;
      }
      case 'd': {  /* an 'int' */
        setivalue(L->top, va_arg(argp, int));
        goto top2str;
      }
      case 'I': {  /* a 'lua_Integer' */
        setivalue(L->top, cast(lua_Integer, va_arg(argp, l_uacInt)));
        goto top2str;
      }
      case 'f': {  /* a 'lua_Number' */
        setfltvalue(L->top, cast_num(va_arg(argp, l_uacNumber)));
      top2str:  /* convert the top element to a string */
        luaD_inctop(L);
        luaO_tostring(L, L->top - 1);
        break;
      }
      case 'p': {  /* a pointer */
        char buff[4*sizeof(void *) + 8]; /* should be enough space for a '%p' */
        void *p = va_arg(argp, void *);
        int l = lua_pointer2str(buff, sizeof(buff), p);
        pushstr(L, buff, l);
        break;
      }
      case 'U': {  /* an 'int' as a UTF-8 sequence */
        char buff[UTF8BUFFSZ];
        int l = luaO_utf8esc(buff, cast(long, va_arg(argp, long)));
        pushstr(L, buff + UTF8BUFFSZ - l, l);
        break;
      }
      case '%': {
        pushstr(L, "%", 1);
        break;
      }
      default: {
        luaG_runerror(L, "invalid option '%%%c' to 'lua_pushfstring'",
                         *(e + 1));
      }
    }
    n += 2;
    fmt = e+2;
  }
  luaD_checkstack(L, 1);
  pushstr(L, fmt, strlen(fmt));
  if (n > 0) luaV_concat(L, n + 1);
  return svalue(L->top - 1);
}